

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O0

bool tinyusdz::VariantSelectPrimSpec
               (PrimSpec *dst,PrimSpec *src,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variant_selection,string *warn,string *err)

{
  __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
  rhs;
  bool bVar1;
  PrimMeta *pPVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
  *pmVar3;
  value_type *pvVar4;
  size_type sVar5;
  string *psVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  size_type sVar9;
  mapped_type *this;
  PrimMeta *rhs_00;
  PropertyMap *pPVar10;
  reference __k;
  mapped_type *this_00;
  vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *this_01;
  vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *pvVar11;
  reference this_02;
  Specifier *pSVar12;
  ostream *poVar13;
  string local_7f8 [32];
  ostringstream local_7d8 [8];
  ostringstream ss_e;
  __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
  local_660;
  PrimSpec *local_658;
  PrimSpec *local_650;
  __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
  local_648;
  __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
  local_640;
  __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
  it;
  PrimSpec *child;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *__range4_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
  *prop;
  const_iterator __end4;
  const_iterator __begin4;
  PropertyMap *__range4;
  PrimSpec *vs;
  mapped_type *vss;
  undefined1 local_5e0 [8];
  string variantName;
  value_type *variantSetName;
  int64_t i;
  PrimSpec ps;
  ListEditQual qual;
  value_type *variantSetMeta;
  string *err_local;
  string *warn_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variant_selection_local;
  PrimSpec *src_local;
  PrimSpec *dst_local;
  
  pPVar2 = PrimSpec::metas(src);
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&pPVar2->variants);
  if (bVar1) {
    pPVar2 = PrimSpec::metas(src);
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&pPVar2->variantSets)
    ;
    if (bVar1) {
      pPVar2 = PrimSpec::metas(src);
      pvVar4 = nonstd::optional_lite::
               optional<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::value(&pPVar2->variantSets);
      ps._asset_search_paths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = pvVar4->first;
      PrimSpec::operator=(dst,src);
      PrimSpec::PrimSpec((PrimSpec *)&i,src);
      variantSetName =
           (value_type *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&pvVar4->second);
      do {
        variantSetName = (value_type *)((long)&variantSetName[-1].loc + 7);
        if ((long)variantSetName < 0) {
          pSVar12 = PrimSpec::specifier((PrimSpec *)&i);
          *pSVar12 = Over;
          bVar1 = OverridePrimSpec(dst,(PrimSpec *)&i,warn,err);
          if (bVar1) {
            pPVar2 = PrimSpec::metas(dst);
            nonstd::optional_lite::
            optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::reset(&pPVar2->variants);
            pPVar2 = PrimSpec::metas(dst);
            nonstd::optional_lite::
            optional<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::reset(&pPVar2->variantSets);
            pmVar3 = PrimSpec::variantSets_abi_cxx11_(dst);
            ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
            ::clear(pmVar3);
            dst_local._7_1_ = true;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_7d8);
            poVar13 = ::std::operator<<((ostream *)local_7d8,"[error]");
            poVar13 = ::std::operator<<(poVar13,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                       );
            poVar13 = ::std::operator<<(poVar13,":");
            poVar13 = ::std::operator<<(poVar13,"VariantSelectPrimSpec");
            poVar13 = ::std::operator<<(poVar13,"():");
            poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x6ad);
            ::std::operator<<(poVar13," ");
            poVar13 = ::std::operator<<((ostream *)local_7d8,"Failed to override PrimSpec.");
            ::std::operator<<(poVar13,"\n");
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::__cxx11::string::operator+=((string *)err,local_7f8);
              ::std::__cxx11::string::~string(local_7f8);
            }
            dst_local._7_1_ = false;
            ::std::__cxx11::ostringstream::~ostringstream(local_7d8);
          }
          PrimSpec::~PrimSpec((PrimSpec *)&i);
          return dst_local._7_1_;
        }
        variantName.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&pvVar4->second,(size_type)variantSetName);
        ::std::__cxx11::string::string((string *)local_5e0);
        sVar5 = ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::count(variant_selection,(key_type *)variantName.field_2._8_8_);
        if (sVar5 == 0) {
          bVar1 = PrimSpec::current_variant_selection
                            (dst,(string *)variantName.field_2._8_8_,(string *)local_5e0);
          if (bVar1) goto LAB_00220b44;
        }
        else {
          psVar6 = (string *)
                   ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::at(variant_selection,(key_type *)variantName.field_2._8_8_);
          ::std::__cxx11::string::operator=((string *)local_5e0,psVar6);
LAB_00220b44:
          pmVar3 = PrimSpec::variantSets_abi_cxx11_(dst);
          sVar7 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
                  ::count(pmVar3,(key_type *)variantName.field_2._8_8_);
          if (sVar7 != 0) {
            pmVar3 = PrimSpec::variantSets_abi_cxx11_(dst);
            pmVar8 = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
                     ::at(pmVar3,(key_type *)variantName.field_2._8_8_);
            sVar9 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                    ::count(&pmVar8->variantSet,(key_type *)local_5e0);
            if (sVar9 != 0) {
              this = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                     ::at(&pmVar8->variantSet,(key_type *)local_5e0);
              pPVar2 = PrimSpec::metas((PrimSpec *)&i);
              rhs_00 = PrimSpec::metas(this);
              PrimMetas::update_from(pPVar2,rhs_00,true);
              pPVar10 = PrimSpec::props_abi_cxx11_(this);
              __end4 = ::std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       ::begin(pPVar10);
              prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
                      *)::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        ::end(pPVar10);
              while (bVar1 = ::std::operator!=(&__end4,(_Self *)&prop), bVar1) {
                __k = ::std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
                      ::operator*(&__end4);
                pPVar10 = PrimSpec::props_abi_cxx11_((PrimSpec *)&i);
                this_00 = ::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                          ::operator[](pPVar10,&__k->first);
                Property::operator=(this_00,&__k->second);
                ::std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
                ::operator++(&__end4);
              }
              this_01 = PrimSpec::children(this);
              __end4_1 = ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::
                         begin(this_01);
              child = (PrimSpec *)
                      ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::end
                                (this_01);
              while (bVar1 = __gnu_cxx::operator!=
                                       (&__end4_1,
                                        (__normal_iterator<const_tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
                                         *)&child), bVar1) {
                it._M_current =
                     __gnu_cxx::
                     __normal_iterator<const_tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
                     ::operator*(&__end4_1);
                pvVar11 = PrimSpec::children((PrimSpec *)&i);
                local_648._M_current =
                     (PrimSpec *)
                     std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::begin
                               (pvVar11);
                pvVar11 = PrimSpec::children((PrimSpec *)&i);
                local_650 = (PrimSpec *)
                            std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::
                            end(pvVar11);
                local_658 = it._M_current;
                local_640 = ::std::
                            find_if<__gnu_cxx::__normal_iterator<tinyusdz::PrimSpec*,std::vector<tinyusdz::PrimSpec,std::allocator<tinyusdz::PrimSpec>>>,tinyusdz::VariantSelectPrimSpec(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                      (local_648,
                                       (__normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
                                        )local_650,it._M_current);
                pvVar11 = PrimSpec::children((PrimSpec *)&i);
                local_660._M_current =
                     (PrimSpec *)
                     std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::end
                               (pvVar11);
                bVar1 = __gnu_cxx::operator!=(&local_640,&local_660);
                rhs = it;
                if (bVar1) {
                  this_02 = __gnu_cxx::
                            __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
                            ::operator*(&local_640);
                  PrimSpec::operator=(this_02,rhs._M_current);
                }
                else {
                  pvVar11 = PrimSpec::children((PrimSpec *)&i);
                  ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::push_back
                            ((vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *)
                             pvVar11,it._M_current);
                }
                __gnu_cxx::
                __normal_iterator<const_tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
                ::operator++(&__end4_1);
              }
            }
          }
        }
        ::std::__cxx11::string::~string((string *)local_5e0);
      } while( true );
    }
  }
  pPVar2 = PrimSpec::metas(src);
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&pPVar2->variants);
  if (bVar1) {
    if (warn != (string *)0x0) {
      ::std::__cxx11::string::operator+=
                ((string *)warn,"`variants` are authored, but `variantSets` is not authored.\n");
    }
    PrimSpec::operator=(dst,src);
    pPVar2 = PrimSpec::metas(dst);
    nonstd::optional_lite::
    optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::reset(&pPVar2->variants);
    pPVar2 = PrimSpec::metas(dst);
    nonstd::optional_lite::
    optional<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::reset(&pPVar2->variantSets);
    pmVar3 = PrimSpec::variantSets_abi_cxx11_(dst);
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
    ::clear(pmVar3);
  }
  else {
    pPVar2 = PrimSpec::metas(src);
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&pPVar2->variantSets)
    ;
    if (bVar1) {
      if (warn != (string *)0x0) {
        ::std::__cxx11::string::operator+=
                  ((string *)warn,"`variantSets` are authored, but `variants` is not authored.\n");
      }
      PrimSpec::operator=(dst,src);
      pPVar2 = PrimSpec::metas(dst);
      nonstd::optional_lite::
      optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::reset(&pPVar2->variants);
      pPVar2 = PrimSpec::metas(dst);
      nonstd::optional_lite::
      optional<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::reset(&pPVar2->variantSets);
      pmVar3 = PrimSpec::variantSets_abi_cxx11_(dst);
      ::std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
      ::clear(pmVar3);
    }
    else {
      PrimSpec::operator=(dst,src);
    }
  }
  return true;
}

Assistant:

bool VariantSelectPrimSpec(
    PrimSpec &dst, const PrimSpec &src,
    const std::map<std::string, std::string> &variant_selection,
    std::string *warn, std::string *err) {
  if (src.metas().variants && src.metas().variantSets) {
    // do variant compsotion
  } else if (src.metas().variants) {
    if (warn) {
      (*warn) +=
          "`variants` are authored, but `variantSets` is not authored.\n";
    }
    dst = src;
    dst.metas().variants.reset();
    dst.metas().variantSets.reset();
    dst.variantSets().clear();
    return true;
  } else if (src.metas().variantSets) {
    if (warn) {
      (*warn) +=
          "`variantSets` are authored, but `variants` is not authored.\n";
    }
    dst = src;
    dst.metas().variants.reset();
    dst.metas().variantSets.reset();
    dst.variantSets().clear();
    // nothing to do.
    return true;
  } else {
    dst = src;
    return true;
  }

  const auto &variantSetMeta = src.metas().variantSets.value();

  const ListEditQual qual = variantSetMeta.first;
  (void)qual;

  dst = src;

  PrimSpec ps = src;  // temp PrimSpec. Init with src.

  // Evaluate from the last element.
  for (int64_t i = int64_t(variantSetMeta.second.size()) - 1; i >= 0; i--) {
    const auto &variantSetName = variantSetMeta.second[size_t(i)];

    // 1. look into `variant_selection`.
    // 2. look into variant setting in this PrimSpec.

    std::string variantName;
    if (variant_selection.count(variantSetName)) {
      variantName = variant_selection.at(variantSetName);
    } else if (dst.current_variant_selection(variantSetName, &variantName)) {
      // ok
    } else {
      continue;
    }

    if (dst.variantSets().count(variantSetName)) {
      const auto &vss = dst.variantSets().at(variantSetName);

      if (vss.variantSet.count(variantName)) {
        const PrimSpec &vs = vss.variantSet.at(variantName);

        DCOUT(fmt::format("variantSet[{}] Select variant: {}", variantSetName,
                          variantName));

        //
        // Promote variant content to PrimSpec.
        //

        // over-like operation
        ps.metas().update_from(vs.metas(), /* override_authored */ true);

        for (const auto &prop : vs.props()) {
          DCOUT("prop: " << prop.first);
          // override existing prop
          ps.props()[prop.first] = prop.second;
        }

        for (const auto &child : vs.children()) {
          // Override if PrimSpec has same name
          // simple linear scan.
          auto it = std::find_if(ps.children().begin(), ps.children().end(),
                                 [&child](const PrimSpec &item) {
                                   return (item.name() == child.name());
                                 });

          if (it != ps.children().end()) {
            (*it) = child;  // replace
          } else {
            ps.children().push_back(child);
          }
        }

        // TODO:
        // - [ ] update `primChildren` and `properties` metadataum if required.
      }
    }
  }

  DCOUT("Variant resolved prim: " << prim::print_primspec(ps));

  // Local properties/metadatum wins against properties/metadataum from Variant
  ps.specifier() = Specifier::Over;
  if (!OverridePrimSpec(dst, ps, warn, err)) {
    PUSH_ERROR_AND_RETURN("Failed to override PrimSpec.");
  }

  dst.metas().variants.reset();
  dst.metas().variantSets.reset();
  dst.variantSets().clear();

  return true;
}